

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  short sVar4;
  int iVar5;
  Table *pTab;
  sqlite3 *db;
  Column *pCVar6;
  sqlite3 **ppsVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  LogEst LVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  Vdbe *pVVar15;
  Parse *pPVar16;
  Token *pTVar17;
  Table *pTable;
  size_t sVar18;
  Expr *pExpr;
  ExprList *pList;
  char *pcVar19;
  int iVar20;
  uint uVar21;
  char *pcVar22;
  Op *pOVar23;
  Schema **ppSVar24;
  u8 *puVar25;
  uint uVar26;
  long lVar27;
  Vdbe *pVVar28;
  short *psVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  sqlite3 *pIdx;
  int iVar33;
  Index *pIVar34;
  bool bVar35;
  char cVar36;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if (((db->init).busy != '\0') && (iVar20 = (db->init).newTnum, pTab->tnum = iVar20, iVar20 == 1))
  {
    pTab->tabFlags = pTab->tabFlags | 1;
  }
  if ((tabOpts & 0x20) != 0) {
    bVar1 = pTab->tabFlags;
    if ((bVar1 & 8) != 0) {
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if ((bVar1 & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    }
    else {
      pTab->tabFlags = bVar1 | 0x60;
      pVVar15 = pParse->pVdbe;
      if (((db->init).imposterTable == '\0') && (sVar2 = pTab->nCol, 0 < (long)sVar2)) {
        pCVar6 = pTab->aCol;
        lVar27 = 0;
        do {
          if (((&pCVar6->colFlags)[lVar27] & 1) != 0) {
            (&pCVar6->notNull)[lVar27] = '\x02';
          }
          lVar27 = lVar27 + 0x20;
        } while ((long)sVar2 * 0x20 != lVar27);
      }
      if (pParse->declareVtab == '\0') {
        iVar20 = pParse->addrCrTab;
        if (iVar20 != 0) {
          if (iVar20 < 0) {
            iVar20 = pVVar15->nOp + -1;
          }
          if (pVVar15->db->mallocFailed == '\0') {
            pOVar23 = pVVar15->aOp + iVar20;
          }
          else {
            pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar23->opcode = 0x85;
        }
        if ((long)pTab->iPKey < 0) {
          pIdx = (sqlite3 *)pTab->pIndex;
          while ((pIdx != (sqlite3 *)0x0 && ((*(byte *)((long)&pIdx->nextPagesize + 3) & 3) != 2)))
          {
            pIdx = *(sqlite3 **)&pIdx->nDb;
          }
          if (pVVar15 != (Vdbe *)0x0) {
            iVar20 = *(int *)&pIdx->nextAutovac;
            if (iVar20 < 0) {
              iVar20 = pVVar15->nOp + -1;
            }
            if (pVVar15->db->mallocFailed == '\0') {
              pOVar23 = pVVar15->aOp + iVar20;
            }
            else {
              pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar23->opcode = '\r';
          }
          iVar20 = 1;
          if (1 < *(ushort *)&pIdx->field_0x5e) {
            pVVar15 = pIdx->pVdbe;
            iVar20 = 1;
            uVar32 = 1;
            do {
              sVar2 = *(short *)((long)&pVVar15->db + uVar32 * 2);
              pVVar28 = pVVar15;
              iVar12 = iVar20;
              do {
                iVar13 = iVar12;
                if (iVar13 < 1) goto LAB_001460bc;
                ppsVar7 = &pVVar28->db;
                pVVar28 = (Vdbe *)((long)&pVVar28->db + 2);
                iVar12 = iVar13 + -1;
              } while (*(short *)ppsVar7 != sVar2);
              if (iVar13 < 1) {
LAB_001460bc:
                lVar27 = (long)iVar20;
                iVar20 = iVar20 + 1;
                *(short *)((long)&pVVar15->db + lVar27 * 2) = sVar2;
              }
              else {
                *(u16 *)&pIdx->nextPagesize = *(u16 *)&pIdx->nextPagesize - 1;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 < *(ushort *)&pIdx->field_0x5e);
          }
          *(u16 *)&pIdx->field_0x5e = (u16)iVar20;
        }
        else {
          dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
          if ((char *)dest._0_8_ == (char *)0x0) {
            uVar21 = 0;
          }
          else {
            sVar18 = strlen((char *)dest._0_8_);
            uVar21 = (uint)sVar18 & 0x3fffffff;
          }
          dest.zAffSdst = (char *)CONCAT44(dest.zAffSdst._4_4_,uVar21);
          bVar35 = false;
          pExpr = sqlite3ExprAlloc(db,0x37,(Token *)&dest,0);
          pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
          pIdx = db;
          if (pList != (ExprList *)0x0) {
            pList->a->sortOrder = pParse->iPkSortOrder;
            sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                               (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0,'\x02');
            if (db->mallocFailed == '\0') {
              pIdx = (sqlite3 *)pTab->pIndex;
              while ((pIdx != (sqlite3 *)0x0 &&
                     ((*(byte *)((long)&pIdx->nextPagesize + 3) & 3) != 2))) {
                pIdx = *(sqlite3 **)&pIdx->nDb;
              }
              pTab->iPKey = -1;
              bVar35 = true;
            }
          }
          if (!bVar35) goto LAB_001458b7;
        }
        bVar1 = *(byte *)((long)&pIdx->nextPagesize + 3);
        *(byte *)((long)&pIdx->nextPagesize + 3) = bVar1 | 0x20;
        if ((db->init).imposterTable == '\0') {
          *(byte *)((long)&pIdx->nextPagesize + 3) = bVar1 | 0x28;
        }
        uVar3 = *(ushort *)&pIdx->field_0x5e;
        uVar32 = (ulong)uVar3;
        uVar8 = *(undefined1 *)((long)&pTab->tnum + 1);
        uVar9 = *(undefined1 *)((long)&pTab->tnum + 2);
        uVar10 = *(undefined1 *)((long)&pTab->tnum + 3);
        pIdx->nextAutovac = *(undefined1 *)&pTab->tnum;
        pIdx->suppressErr = uVar8;
        pIdx->vtabOnConflict = uVar9;
        pIdx->isTransactionSavepoint = uVar10;
        for (pIVar34 = pTab->pIndex; pIVar34 != (Index *)0x0; pIVar34 = pIVar34->pNext) {
          cVar36 = '\n';
          if ((pIVar34->field_0x63 & 3) != 2) {
            if (uVar32 == 0) {
              iVar20 = 0;
            }
            else {
              uVar30 = 0;
              iVar20 = 0;
              do {
                psVar29 = pIVar34->aiColumn;
                uVar21 = (uint)pIVar34->nKeyCol;
                do {
                  uVar26 = uVar21;
                  if ((int)uVar26 < 1) break;
                  sVar2 = *psVar29;
                  psVar29 = psVar29 + 1;
                  uVar21 = uVar26 - 1;
                } while (sVar2 != *(short *)((long)&pIdx->pVdbe->db + uVar30 * 2));
                iVar20 = iVar20 + (uint)((int)uVar26 < 1);
                uVar30 = uVar30 + 1;
              } while (uVar30 != uVar32);
            }
            if (iVar20 == 0) {
              pIVar34->nColumn = pIVar34->nKeyCol;
            }
            else {
              iVar20 = resizeIndexObject(db,pIVar34,iVar20 + (uint)pIVar34->nKeyCol);
              cVar36 = iVar20 != 0;
              if ((!(bool)cVar36) && (uVar3 != 0)) {
                uVar21 = (uint)pIVar34->nKeyCol;
                uVar30 = 0;
                do {
                  sVar2 = *(short *)((long)&pIdx->pVdbe->db + uVar30 * 2);
                  psVar29 = pIVar34->aiColumn;
                  uVar26 = (uint)pIVar34->nKeyCol;
                  do {
                    uVar31 = uVar26;
                    if ((int)uVar31 < 1) goto LAB_001461f8;
                    sVar4 = *psVar29;
                    psVar29 = psVar29 + 1;
                    uVar26 = uVar31 - 1;
                  } while (sVar4 != sVar2);
                  if ((int)uVar31 < 1) {
LAB_001461f8:
                    pIVar34->aiColumn[(int)uVar21] = sVar2;
                    pIVar34->azColl[(int)uVar21] =
                         *(char **)(*(long *)&pIdx->openFlags + uVar30 * 8);
                    uVar21 = uVar21 + 1;
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar32);
                cVar36 = '\0';
              }
            }
          }
          if ((cVar36 != '\n') && (cVar36 != '\0')) goto LAB_001458b7;
        }
        sVar2 = pTab->nCol;
        if ((int)(uint)uVar3 < (int)sVar2) {
          iVar20 = resizeIndexObject(db,(Index *)pIdx,(int)sVar2);
          if ((iVar20 == 0) && (0 < pTab->nCol)) {
            iVar20 = 0;
            do {
              iVar12 = (int)uVar32;
              pVVar15 = pIdx->pVdbe;
              uVar30 = uVar32;
              do {
                iVar13 = (int)uVar30;
                if (iVar13 < 1) goto LAB_001462a5;
                uVar30 = (ulong)(iVar13 - 1);
                ppsVar7 = &pVVar15->db;
                pVVar15 = (Vdbe *)((long)&pVVar15->db + 2);
              } while (iVar20 != *(short *)ppsVar7);
              if (iVar13 < 1) {
LAB_001462a5:
                *(short *)((long)&pIdx->pVdbe->db + (long)iVar12 * 2) = (short)iVar20;
                *(char **)(*(long *)&pIdx->openFlags + (long)iVar12 * 8) = "BINARY";
                uVar32 = (ulong)(iVar12 + 1);
              }
              iVar20 = iVar20 + 1;
            } while (iVar20 < pTab->nCol);
          }
        }
        else {
          *(short *)&pIdx->nextPagesize = sVar2;
        }
      }
    }
  }
LAB_001458b7:
  if (pTab->pSchema == (Schema *)0x0) {
    uVar32 = 0xfff0bdc0;
  }
  else {
    uVar21 = db->nDb;
    if ((int)uVar21 < 1) {
      uVar32 = 0;
    }
    else {
      ppSVar24 = &db->aDb->pSchema;
      uVar32 = 0;
      do {
        if (*ppSVar24 == pTab->pSchema) goto LAB_0014595b;
        uVar32 = uVar32 + 1;
        ppSVar24 = ppSVar24 + 4;
      } while (uVar21 != uVar32);
      uVar32 = (ulong)uVar21;
    }
  }
LAB_0014595b:
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  if (pTab->nCol < 1) {
    iVar20 = 0;
  }
  else {
    iVar12 = pTab->nCol + 1;
    puVar25 = &pTab->aCol->szEst;
    iVar20 = 0;
    do {
      iVar20 = iVar20 + (uint)*puVar25;
      iVar12 = iVar12 + -1;
      puVar25 = puVar25 + 0x20;
    } while (1 < iVar12);
  }
  LVar11 = sqlite3LogEst((ulong)(((uint)((ushort)pTab->iPKey >> 0xf) + iVar20) * 4));
  pTab->szTabRow = LVar11;
  for (pIVar34 = pTab->pIndex; pIVar34 != (Index *)0x0; pIVar34 = pIVar34->pNext) {
    estimateIndexWidth(pIVar34);
  }
  if ((db->init).busy == '\0') {
    pVVar15 = pParse->pVdbe;
    if (pVVar15 == (Vdbe *)0x0) {
      pVVar15 = allocVdbe(pParse);
    }
    if (pVVar15 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp3(pVVar15,0x6f,0,0,0);
    bVar35 = pTab->pSelect == (Select *)0x0;
    pcVar19 = "CREATE_VIEW";
    if (bVar35) {
      pcVar19 = "CREATE_TABLE";
    }
    pcVar22 = "view";
    if (bVar35) {
      pcVar22 = "table";
    }
    iVar20 = (int)uVar32;
    if (pSelect == (Select *)0x0) {
      pTVar17 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar17 = pEnd;
      }
      uVar21 = (int)pTVar17->z - (int)(pParse->sNameToken).z;
      if (*pTVar17->z != ';') {
        uVar21 = uVar21 + pTVar17->n;
      }
      pcVar19 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar19 + 7,(ulong)uVar21);
    }
    else {
      iVar12 = pParse->nMem;
      iVar33 = iVar12 + 1;
      iVar13 = iVar12 + 3;
      pParse->nMem = iVar13;
      pPVar16 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar16 = pParse;
      }
      pPVar16->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar15,0x69,1,pParse->regRoot,iVar20);
      iVar5 = pVVar15->nOp;
      if (0 < (long)iVar5) {
        pVVar15->aOp[(long)iVar5 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar15,0xf,iVar33,0,iVar5 + 1);
      dest.eDest = '\r';
      dest.zAffSdst = (char *)0x0;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.iSDParm = iVar33;
      sqlite3Select(pParse,pSelect,&dest);
      sqlite3VdbeAddOp3(pVVar15,0x49,iVar33,0,0);
      pPVar16 = pVVar15->pParse;
      pPVar16->nTempReg = '\0';
      pPVar16->nRangeReg = 0;
      if (pVVar15->db->mallocFailed == '\0') {
        iVar33 = pVVar15->nOp + -1;
        if (-1 < iVar5) {
          iVar33 = iVar5;
        }
        pOVar23 = pVVar15->aOp + iVar33;
      }
      else {
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar23->p2 = pVVar15->nOp;
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTable == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTable->nCol;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTable);
      iVar33 = sqlite3VdbeAddOp3(pVVar15,0x10,dest.iSDParm,0,0);
      sqlite3VdbeAddOp3(pVVar15,99,dest.iSdst,dest.nSdst,iVar12 + 2);
      sqlite3TableAffinity(pVVar15,pTab,0);
      sqlite3VdbeAddOp3(pVVar15,0x72,1,iVar13,0);
      sqlite3VdbeAddOp3(pVVar15,0x73,1,iVar12 + 2,iVar13);
      sqlite3VdbeAddOp3(pVVar15,0xd,0,iVar33,0);
      if (pVVar15->db->mallocFailed == '\0') {
        iVar12 = pVVar15->nOp + -1;
        if (-1 < iVar33) {
          iVar12 = iVar33;
        }
        pOVar23 = pVVar15->aOp + iVar12;
      }
      else {
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar23->p2 = pVVar15->nOp;
      sqlite3VdbeAddOp3(pVVar15,0x6f,1,0,0);
      pcVar19 = createTableStmt(db,pTab);
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar20].zDbSName,"sqlite_master",pcVar22,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar19,(ulong)(uint)pParse->regRowid);
    sqlite3DbFree(db,pcVar19);
    sqlite3VdbeAddOp3(pParse->pVdbe,0x66,iVar20,1,
                      (pParse->db->aDb[iVar20].pSchema)->schema_cookie + 1);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar20].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar20].zDbSName
                        );
    }
    pcVar19 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar15,iVar20,pcVar19);
  }
  if ((db->init).busy != '\0') {
    pvVar14 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
    if (pvVar14 == (void *)0x0) {
      pParse->pNewTable = (Table *)0x0;
      *(byte *)&db->flags = (byte)db->flags | 2;
      if (pTab->pSelect == (Select *)0x0) {
        pcVar19 = (pParse->sNameToken).z;
        if (pCons->z != (char *)0x0) {
          pEnd = pCons;
        }
        iVar20 = sqlite3Utf8CharLen(pcVar19,*(int *)&pEnd->z - (int)pcVar19);
        pTab->addColOffset = iVar20 + 0xd;
      }
    }
    else if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
      db->mallocFailed = '\x01';
      if (0 < db->nVdbeExec) {
        (db->u1).isInterrupted = 1;
      }
      (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  assert( !db->init.busy || !pSelect );

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->flags |= SQLITE_InternChanges;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}